

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteBase64(xmlTextWriterPtr writer,char *data,int start,int len)

{
  long lVar1;
  int iVar2;
  xmlLinkPtr lk;
  xmlTextWriterStackEntry *p;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined2 local_53;
  byte local_51;
  char local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  int local_4c;
  int local_48;
  int local_44;
  char *local_40;
  xmlOutputBufferPtr local_38;
  
  iVar2 = -1;
  if (-1 < (len | start) && (data != (char *)0x0 && writer != (xmlTextWriterPtr)0x0)) {
    local_40 = data;
    lk = xmlListFront(writer->nodes);
    local_48 = 0;
    if (((lk == (xmlLinkPtr)0x0) ||
        (p = (xmlTextWriterStackEntry *)xmlLinkGetData(lk), p == (xmlTextWriterStackEntry *)0x0)) ||
       (local_48 = xmlTextWriterHandleStateDependencies(writer,p), -1 < local_48)) {
      if (writer->indent != 0) {
        writer->doindent = 0;
      }
      local_38 = writer->out;
      if ((local_38 != (xmlOutputBufferPtr)0x0) && (iVar2 = local_48, 0 < len)) {
        local_40 = local_40 + (uint)start;
        iVar8 = 0;
        local_4c = 0;
        uVar7 = 0;
        local_44 = len;
        do {
          local_51 = 0;
          local_53 = 0;
          uVar6 = (uint)uVar7;
          uVar3 = ~uVar6 + local_44;
          if (1 < uVar3) {
            uVar3 = 2;
          }
          memcpy(&local_53,local_40 + (int)uVar6,(ulong)(uVar3 + 1));
          uVar5 = 0;
          do {
            uVar4 = uVar5;
            uVar5 = uVar4 + 1;
            lVar1 = (long)(int)uVar6 + 1 + uVar4;
            if (1 < uVar4) break;
          } while (lVar1 < len);
          local_50 = xmlOutputBufferWriteBase64_dtable[(byte)local_53 >> 2];
          local_4f = xmlOutputBufferWriteBase64_dtable
                     [(uint)(local_53._1_1_ >> 4) | ((byte)local_53 & 3) << 4];
          local_4e = xmlOutputBufferWriteBase64_dtable
                     [(uint)(local_51 >> 6) + (local_53._1_1_ & 0xf) * 4];
          local_4d = xmlOutputBufferWriteBase64_dtable[local_51 & 0x3f];
          if ((uVar4 < 2) && (local_4d = 0x3d, uVar5 != 2)) {
            local_4e = 0x3d;
          }
          if (0x47 < local_4c) {
            iVar2 = xmlOutputBufferWrite(local_38,2,"\r\n");
            if (iVar2 == -1) {
              return -1;
            }
            iVar8 = iVar2 + iVar8;
            local_4c = 0;
          }
          iVar2 = xmlOutputBufferWrite(local_38,4,&local_50);
          if (iVar2 == -1) {
            return -1;
          }
          iVar8 = iVar2 + iVar8;
          if (len <= lVar1) break;
          uVar7 = (uVar7 & 0xffffffff) + uVar5;
          local_4c = local_4c + 4;
        } while ((int)uVar7 < local_44);
        iVar2 = -1;
        if (-1 < iVar8) {
          iVar2 = iVar8 + local_48;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlTextWriterWriteBase64(xmlTextWriterPtr writer, const char *data,
                         int start, int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (data == NULL) || (start < 0) || (len < 0))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            count = xmlTextWriterHandleStateDependencies(writer, p);
            if (count < 0)
                return -1;
            sum += count;
        }
    }

    if (writer->indent)
        writer->doindent = 0;

    count =
        xmlOutputBufferWriteBase64(writer->out, len,
                                   (unsigned char *) data + start);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}